

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_projection2.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  ALLEGRO_BITMAP *pAVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ALLEGRO_BITMAP *pAVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  bool bVar13;
  char *pcVar14;
  bool bVar15;
  bool bVar16;
  char *unaff_R14;
  float fVar17;
  float fVar18;
  float in_XMM3_Da;
  ALLEGRO_EVENT event;
  undefined1 auStack_100 [64];
  code *pcStack_c0;
  float local_b0;
  uint local_ac;
  long local_a8;
  ALLEGRO_BITMAP *local_a0;
  undefined8 local_98;
  ALLEGRO_BITMAP *local_90;
  undefined8 local_88;
  ALLEGRO_BITMAP *local_80;
  int local_78 [8];
  int local_58;
  
  lVar12 = 0x10;
  if (1 < argc) {
    unaff_R14 = argv[1];
    pcStack_c0 = (code *)0x1025e0;
    iVar4 = strcmp(unaff_R14,"--use-shaders");
    lVar12 = 0x810;
    if (iVar4 != 0) goto LAB_00102a3d;
  }
  pcStack_c0 = (code *)0x1025fe;
  cVar3 = al_install_system(0x5020700,atexit);
  if (cVar3 == '\0') {
    pcVar14 = "Could not init Allegro.\n";
  }
  else {
    pcStack_c0 = (code *)0x10260b;
    al_init_image_addon();
    pcStack_c0 = (code *)0x102610;
    al_init_primitives_addon();
    pcStack_c0 = (code *)0x102615;
    al_init_font_addon();
    pcStack_c0 = (code *)0x10261a;
    al_install_keyboard();
    pcStack_c0 = (code *)0x102621;
    al_set_new_display_flags(lVar12);
    pcStack_c0 = (code *)0x102635;
    al_set_new_display_option(0xf,0x10,2);
    pcStack_c0 = (code *)0x102646;
    al_set_new_display_option(0x1c,0,1);
    pcStack_c0 = (code *)0x102655;
    lVar7 = al_create_display(800,600);
    if (lVar7 == 0) {
      pcVar14 = "Error creating display\n";
    }
    else {
      pcStack_c0 = (code *)0x102678;
      al_set_window_constraints(lVar7,0x100,0x200,0,0);
      pcStack_c0 = (code *)0x102685;
      al_apply_window_constraints(lVar7,1);
      pcStack_c0 = (code *)0x10268d;
      pAVar8 = (ALLEGRO_BITMAP *)al_get_backbuffer(lVar7);
      pcStack_c0 = (code *)0x102695;
      set_perspective_transform(pAVar8);
      pcStack_c0 = (code *)0x10269d;
      uVar9 = al_get_backbuffer(lVar7);
      pcStack_c0 = (code *)0x1026b4;
      local_80 = (ALLEGRO_BITMAP *)al_create_sub_bitmap(uVar9,0,0,0x100,0x100);
      pcStack_c0 = (code *)0x1026c1;
      set_perspective_transform(local_80);
      pcStack_c0 = (code *)0x1026c9;
      uVar9 = al_get_backbuffer(lVar7);
      pcStack_c0 = (code *)0x1026e0;
      local_88 = al_create_sub_bitmap(uVar9,0,0,0x100,0x200);
      pcStack_c0 = (code *)0x1026f4;
      local_90 = (ALLEGRO_BITMAP *)al_create_bitmap(200,200);
      pcStack_c0 = (code *)0x102701;
      set_perspective_transform(local_90);
      pcStack_c0 = (code *)0x10270e;
      uVar9 = al_create_timer(0x11111111);
      pcStack_c0 = (code *)0x102716;
      local_98 = al_create_builtin_font();
      pcStack_c0 = (code *)0x102720;
      uVar10 = al_create_event_queue();
      pcStack_c0 = (code *)0x102728;
      uVar11 = al_get_keyboard_event_source();
      pcStack_c0 = (code *)0x102733;
      al_register_event_source(uVar10,uVar11);
      pcStack_c0 = (code *)0x10273b;
      uVar11 = al_get_display_event_source(lVar7);
      pcStack_c0 = (code *)0x102746;
      al_register_event_source(uVar10,uVar11);
      pcStack_c0 = (code *)0x10274e;
      uVar11 = al_get_timer_event_source(uVar9);
      pcStack_c0 = (code *)0x102759;
      al_register_event_source(uVar10,uVar11);
      pcStack_c0 = (code *)0x102763;
      al_set_new_bitmap_flags(0x1c0);
      pcStack_c0 = (code *)0x10276f;
      local_a0 = (ALLEGRO_BITMAP *)al_load_bitmap("data/bkg.png");
      if (local_a0 != (ALLEGRO_BITMAP *)0x0) {
        pcStack_c0 = (code *)0x102785;
        al_start_timer(uVar9);
        local_b0 = 0.0;
        bVar16 = false;
        bVar15 = false;
        local_ac = 0;
        bVar13 = false;
        local_a8 = lVar7;
        do {
          pcStack_c0 = (code *)0x1027b0;
          al_wait_for_event(uVar10,local_78);
          switch(local_78[0]) {
          case 0x29:
            pcStack_c0 = (code *)0x1027d4;
            al_acknowledge_resize(lVar7);
LAB_0010286f:
            pcStack_c0 = (code *)0x102877;
            pAVar8 = (ALLEGRO_BITMAP *)al_get_backbuffer(lVar7);
            pcStack_c0 = (code *)0x10287f;
            set_perspective_transform(pAVar8);
            break;
          case 0x2a:
switchD_001027ca_caseD_2a:
            bVar15 = true;
            break;
          case 0x2b:
          case 0x2c:
          case 0x2d:
          case 0x2e:
          case 0x2f:
            break;
          case 0x30:
            pcStack_c0 = (code *)0x102830;
            al_acknowledge_drawing_halt(lVar7);
            pcStack_c0 = (code *)0x102838;
            al_stop_timer(uVar9);
            bVar13 = true;
            break;
          case 0x31:
            pcStack_c0 = (code *)0x10281c;
            al_acknowledge_drawing_resume(lVar7);
            pcStack_c0 = (code *)0x102824;
            al_start_timer(uVar9);
            bVar13 = false;
            break;
          default:
            if (local_78[0] == 10) {
              if (local_58 == 0x4b) {
                uVar5 = local_ac ^ 1;
                local_ac = CONCAT31((int3)(local_ac >> 8),(char)uVar5) & 0xffffff01;
                pcStack_c0 = (code *)0x10286f;
                al_set_display_flag(lVar7,0x200,uVar5 & 1);
                goto LAB_0010286f;
              }
              if (local_58 == 0x3b) goto switchD_001027ca_caseD_2a;
            }
            else if (local_78[0] == 0x1e) {
              pcStack_c0 = (code *)0x102805;
              dVar1 = fmod((double)local_b0 + 0.05,6.283185307179586);
              local_b0 = (float)dVar1;
              bVar16 = true;
            }
          }
          if ((!bVar13) && (bVar16)) {
            pcStack_c0 = (code *)0x10289b;
            cVar3 = al_is_event_queue_empty(uVar10);
            if (cVar3 != '\0') {
              pcStack_c0 = (code *)0x1028ab;
              al_set_target_backbuffer(lVar7);
              pcStack_c0 = (code *)0x1028ba;
              al_set_render_state(0x12,1);
              fVar17 = 0.0;
              fVar18 = 0.0;
              pcStack_c0 = (code *)0x1028c8;
              al_map_rgb_f(0);
              pcStack_c0 = (code *)0x1028cd;
              al_clear_to_color();
              pcStack_c0 = (code *)0x1028da;
              al_clear_depth_buffer(0x447a0000);
              pAVar8 = local_a0;
              pcStack_c0 = (code *)0x1028ed;
              draw_pyramid(local_a0,local_b0,fVar17,fVar18,in_XMM3_Da);
              pAVar2 = local_90;
              pcStack_c0 = (code *)0x1028fd;
              al_set_target_bitmap(local_90);
              pcStack_c0 = (code *)0x10290c;
              al_set_render_state(0x12,1);
              fVar17 = 0.1;
              fVar18 = 0.1;
              pcStack_c0 = (code *)0x10291f;
              al_map_rgb_f(0);
              pcStack_c0 = (code *)0x102924;
              al_clear_to_color();
              pcStack_c0 = (code *)0x102931;
              al_clear_depth_buffer(0x447a0000);
              pcStack_c0 = (code *)0x10293f;
              draw_pyramid(pAVar8,local_b0,fVar17,fVar18,in_XMM3_Da);
              pcStack_c0 = (code *)0x102949;
              al_set_target_bitmap(local_80);
              pcStack_c0 = (code *)0x102958;
              al_set_render_state(0x12,1);
              fVar17 = 0.0;
              fVar18 = 0.25;
              pcStack_c0 = (code *)0x10296b;
              al_map_rgb_f(0);
              pcStack_c0 = (code *)0x102970;
              al_clear_to_color();
              pcStack_c0 = (code *)0x10297d;
              al_clear_depth_buffer(0x447a0000);
              pcStack_c0 = (code *)0x10298b;
              draw_pyramid(pAVar8,local_b0,fVar17,fVar18,in_XMM3_Da);
              pcStack_c0 = (code *)0x102995;
              al_set_target_bitmap(local_88);
              bVar16 = false;
              pcStack_c0 = (code *)0x1029a4;
              al_set_render_state(0x12,0);
              pcStack_c0 = (code *)0x1029b7;
              al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
              in_XMM3_Da = 16.0;
              pcStack_c0 = (code *)0x1029dd;
              al_draw_text(local_98,1,"Press Space to toggle fullscreen");
              lVar7 = local_a8;
              pcStack_c0 = (code *)0x1029fa;
              al_draw_bitmap(0,pAVar2,0);
              pcStack_c0 = (code *)0x1029ff;
              al_flip_display();
            }
          }
          if (bVar15) {
            return 0;
          }
        } while( true );
      }
      pcVar14 = "Could not load data/bkg.png";
      local_a0 = (ALLEGRO_BITMAP *)0x0;
      lVar12 = lVar7;
    }
  }
  pcStack_c0 = (code *)0x102a3d;
  abort_example(pcVar14);
LAB_00102a3d:
  pcVar14 = "Unknown command line argument: %s\n";
  pcStack_c0 = set_perspective_transform;
  abort_example("Unknown command line argument: %s\n",unaff_R14);
  pcStack_c0 = (code *)lVar12;
  iVar4 = al_get_bitmap_height();
  iVar6 = al_get_bitmap_width(pcVar14);
  al_set_target_bitmap(pcVar14);
  al_identity_transform(auStack_100);
  al_perspective_transform
            (0xbf800000,(float)iVar4 / (float)iVar6,0x3f800000,0x3f800000,
             -((float)iVar4 / (float)iVar6),0x447a0000,auStack_100);
  iVar4 = al_use_projection_transform(auStack_100);
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_BITMAP *texture;
   ALLEGRO_BITMAP *display_sub_persp;
   ALLEGRO_BITMAP *display_sub_ortho;
   ALLEGRO_BITMAP *buffer;
   ALLEGRO_FONT *font;
   bool redraw = false;
   bool quit = false;
   bool fullscreen = false;
   bool background = false;
   int display_flags = ALLEGRO_RESIZABLE;
   float theta = 0;

   if (argc > 1) {
      if(strcmp(argv[1], "--use-shaders") == 0) {
         display_flags |= ALLEGRO_PROGRAMMABLE_PIPELINE;
      }
      else {
         abort_example("Unknown command line argument: %s\n", argv[1]);
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_image_addon();
   al_init_primitives_addon();
   al_init_font_addon();
   init_platform_specific();
   al_install_keyboard();

   al_set_new_display_flags(display_flags);
   al_set_new_display_option(ALLEGRO_DEPTH_SIZE, 16, ALLEGRO_SUGGEST);
   /* Load everything as a POT bitmap to make sure the projection stuff works
    * with mismatched backing texture and bitmap sizes. */
   al_set_new_display_option(ALLEGRO_SUPPORT_NPOT_BITMAP, 0, ALLEGRO_REQUIRE);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Error creating display\n");
   }
   al_set_window_constraints(display, 256, 512, 0, 0);
   al_apply_window_constraints(display, true);
   set_perspective_transform(al_get_backbuffer(display));

   /* This bitmap is a sub-bitmap of the display, and has a perspective transformation. */
   display_sub_persp = al_create_sub_bitmap(al_get_backbuffer(display), 0, 0, 256, 256);
   set_perspective_transform(display_sub_persp);

   /* This bitmap is a sub-bitmap of the display, and has a orthographic transformation. */
   display_sub_ortho = al_create_sub_bitmap(al_get_backbuffer(display), 0, 0, 256, 512);

   /* This bitmap has a perspective transformation, purposefully non-POT */
   buffer = al_create_bitmap(200, 200);
   set_perspective_transform(buffer);

   timer = al_create_timer(1.0 / 60);
   font = al_create_builtin_font();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR |
      ALLEGRO_MIPMAP);

   texture = al_load_bitmap("data/bkg.png");
   if (!texture) {
      abort_example("Could not load data/bkg.png");
   }

   al_start_timer(timer);
   while (!quit) {
      ALLEGRO_EVENT event;

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            quit = true;
            break;
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(display);
            set_perspective_transform(al_get_backbuffer(display));
            break;
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_ESCAPE:
                  quit = true;
                  break;
               case ALLEGRO_KEY_SPACE:
                  fullscreen = !fullscreen;
                  al_set_display_flag(display, ALLEGRO_FULLSCREEN_WINDOW, fullscreen);
                  set_perspective_transform(al_get_backbuffer(display));
                  break;
            }
            break;
         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            theta = fmod(theta + 0.05, 2 * ALLEGRO_PI);
            break;
         case ALLEGRO_EVENT_DISPLAY_HALT_DRAWING:
            background = true;
            al_acknowledge_drawing_halt(display);
            al_stop_timer(timer);
            break;
         case ALLEGRO_EVENT_DISPLAY_RESUME_DRAWING:
            background = false;
            al_acknowledge_drawing_resume(display);
            al_start_timer(timer);
            break;
      }

      if (!background && redraw && al_is_event_queue_empty(queue)) {
         al_set_target_backbuffer(display);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(buffer);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0.1, 0.1));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(display_sub_persp);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0, 0.25));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(display_sub_ortho);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 0);
         al_draw_text(font, al_map_rgb_f(1, 1, 1), 128, 16, ALLEGRO_ALIGN_CENTER,
                      "Press Space to toggle fullscreen");
         al_draw_bitmap(buffer, 0, 256, 0);

         al_flip_display();
         redraw = false;
      }
   }
   return 0;
}